

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O2

Image * denoiseImage(Image *__return_storage_ptr__,Image *in,ImageChannelDesc *Ldesc,
                    Image *varianceImage,ImageChannelDesc *albedoDesc,ImageChannelDesc *zDesc,
                    ImageChannelDesc *deltaZDesc,ImageChannelDesc *nDesc,int halfWidth,int nLevels)

{
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar1;
  undefined8 uVar2;
  bool bVar3;
  Allocator AVar4;
  Tuple2<pbrt::Point2,_int> TVar5;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar6;
  uint uVar7;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar8;
  ulong uVar9;
  int c;
  Point2i PVar10;
  int i;
  long lVar11;
  float fVar12;
  Float FVar13;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  allocator<char> local_363;
  allocator<char> local_362;
  allocator<char> local_361;
  ulong local_360;
  int delta;
  long local_350;
  ImageChannelDesc *local_348;
  Image *local_340;
  ImageChannelDesc *local_338;
  ImageChannelDesc *local_330;
  WrapMode2D local_328;
  WrapMode2D local_320;
  ColorEncodingHandle local_318;
  vector<float,_std::allocator<float>_> f;
  WrapMode2D local_2f8;
  WrapMode2D local_2f0;
  _Any_data local_2e8;
  code *pcStack_2d8;
  code *pcStack_2d0;
  ImageChannelValues L;
  string local_288 [32];
  ColorEncodingHandle local_268;
  ImageChannelValues albedo;
  string local_220 [216];
  Image illum;
  
  TVar5 = (in->resolution).super_Tuple2<pbrt::Point2,_int>;
  local_348 = albedoDesc;
  local_340 = varianceImage;
  local_338 = zDesc;
  local_330 = Ldesc;
  std::__cxx11::string::string<std::allocator<char>>((string *)&albedo,"R",(allocator<char> *)&L);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &albedo.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nAlloc,
             "G",(allocator<char> *)&f);
  std::__cxx11::string::string<std::allocator<char>>(local_220,"B",(allocator<char> *)&delta);
  local_268.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  AVar4.memoryResource = pstd::pmr::new_delete_resource();
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&albedo;
  pbrt::Image::Image(&illum,Float,(Point2i)TVar5,channels,&local_268,AVar4);
  lVar11 = 0x40;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&albedo.
                       super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc
                       .memoryResource + lVar11));
    lVar11 = lVar11 + -0x20;
  } while (lVar11 != -0x20);
  paVar1 = &albedo.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.field_2;
  TVar5 = (in->resolution).super_Tuple2<pbrt::Point2,_int>;
  lVar11 = 0;
  while (lVar11 < (long)TVar5 >> 0x20) {
    local_360 = lVar11 << 0x20;
    local_350 = lVar11;
    for (uVar9 = 0; (long)uVar9 < (long)TVar5.x; uVar9 = uVar9 + 1) {
      pbrt::WrapMode2D::WrapMode2D(&local_2f0,Clamp);
      PVar10.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_360 | uVar9);
      pbrt::Image::GetChannels(&albedo,in,PVar10,local_348,local_2f0);
      pbrt::WrapMode2D::WrapMode2D(&local_2f8,Clamp);
      pbrt::Image::GetChannels(&L,in,PVar10,local_330,local_2f8);
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        paVar6 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)albedo.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                    ptr;
        if (albedo.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
            (float *)0x0) {
          paVar6 = paVar1;
        }
        paVar8 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)L.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr;
        if (L.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
            (float *)0x0) {
          paVar8 = &L.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                    field_2;
        }
        uVar2 = vcmpss_avx512f(ZEXT416((uint)paVar6->fixed[lVar11]),ZEXT416(0),0xe);
        bVar3 = (bool)((byte)uVar2 & 1);
        pbrt::Image::SetChannel
                  (&illum,PVar10,(int)lVar11,
                   (Float)((uint)bVar3 * (int)(paVar8->fixed[lVar11] / paVar6->fixed[lVar11]) +
                          (uint)!bVar3 * (int)paVar8->fixed[lVar11]));
      }
      pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                (&L.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>);
      pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                (&albedo.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>);
      TVar5 = (in->resolution).super_Tuple2<pbrt::Point2,_int>;
    }
    lVar11 = local_350 + 1;
  }
  albedo.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
  memoryResource._0_4_ = 0;
  std::vector<float,_std::allocator<float>_>::vector
            (&f,(long)halfWidth + 1,(value_type *)&albedo,(allocator_type *)&L);
  for (lVar11 = 0; lVar11 <= halfWidth; lVar11 = lVar11 + 1) {
    fVar12 = pbrt::FastExp(((float)(int)lVar11 / (float)halfWidth) * -3.0);
    f.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    [lVar11] = fVar12;
  }
  denoiseImage::call = denoiseImage::call + 1;
  pbrt::Image::Image(__return_storage_ptr__,&illum);
  uVar7 = 0;
  local_360 = CONCAT44(local_360._4_4_,~(nLevels >> 0x1f) & nLevels);
  while( true ) {
    if (uVar7 == (uint)local_360) break;
    delta = 1 << (uVar7 & 0x1f);
    TVar5 = (in->resolution).super_Tuple2<pbrt::Point2,_int>;
    std::__cxx11::string::string<std::allocator<char>>((string *)&L,"R",&local_361);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &L.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nAlloc,"G"
               ,&local_362);
    std::__cxx11::string::string<std::allocator<char>>(local_288,"B",&local_363);
    local_318.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    AVar4.memoryResource = pstd::pmr::new_delete_resource();
    channels_00.n = 3;
    channels_00.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&L;
    pbrt::Image::Image((Image *)&albedo,Float,(Point2i)TVar5,channels_00,&local_318,AVar4);
    lVar11 = 0x40;
    do {
      std::__cxx11::string::~string
                ((string *)
                 ((long)&L.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                         alloc.memoryResource + lVar11));
      lVar11 = lVar11 + -0x20;
    } while (lVar11 != -0x20);
    TVar5 = (__return_storage_ptr__->resolution).super_Tuple2<pbrt::Point2,_int>;
    local_2e8._M_unused._M_object = (void *)0x0;
    local_2e8._8_8_ = 0;
    pcStack_2d8 = (code *)0x0;
    pcStack_2d0 = (code *)0x0;
    local_2e8._M_unused._M_object = operator_new(0x50);
    *(Image **)local_2e8._M_unused._0_8_ = __return_storage_ptr__;
    *(Image **)((long)local_2e8._M_unused._0_8_ + 8) = in;
    *(ImageChannelDesc **)((long)local_2e8._M_unused._0_8_ + 0x10) = local_338;
    *(ImageChannelDesc **)((long)local_2e8._M_unused._0_8_ + 0x18) = deltaZDesc;
    *(ImageChannelDesc **)((long)local_2e8._M_unused._0_8_ + 0x20) = nDesc;
    *(Image **)((long)local_2e8._M_unused._0_8_ + 0x28) = local_340;
    *(int **)((long)local_2e8._M_unused._0_8_ + 0x30) = &halfWidth;
    *(int **)((long)local_2e8._M_unused._0_8_ + 0x38) = &delta;
    *(vector<float,_std::allocator<float>_> **)((long)local_2e8._M_unused._0_8_ + 0x40) = &f;
    *(Image **)((long)local_2e8._M_unused._0_8_ + 0x48) = (Image *)&albedo;
    pcStack_2d0 = std::
                  _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1897:53)>
                  ::_M_invoke;
    pcStack_2d8 = std::
                  _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1897:53)>
                  ::_M_manager;
    pbrt::ParallelFor(0,(long)TVar5 >> 0x20,(function<void_(long,_long)> *)&local_2e8);
    std::_Function_base::~_Function_base((_Function_base *)&local_2e8);
    pstd::swap<pbrt::Image>((Image *)&albedo,__return_storage_ptr__);
    pbrt::Image::~Image((Image *)&albedo);
    uVar7 = uVar7 + 1;
  }
  TVar5 = (__return_storage_ptr__->resolution).super_Tuple2<pbrt::Point2,_int>;
  lVar11 = 0;
  while (lVar11 < (long)TVar5 >> 0x20) {
    local_360 = lVar11 << 0x20;
    local_350 = lVar11;
    for (uVar9 = 0; (long)uVar9 < (long)TVar5.x; uVar9 = uVar9 + 1) {
      pbrt::WrapMode2D::WrapMode2D(&local_320,Clamp);
      PVar10.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_360 | uVar9);
      pbrt::Image::GetChannels(&albedo,in,PVar10,local_348,local_320);
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        pbrt::WrapMode2D::WrapMode2D(&local_328,Clamp);
        FVar13 = pbrt::Image::GetChannel(__return_storage_ptr__,PVar10,(int)lVar11,local_328);
        paVar6 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)albedo.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                    ptr;
        if (albedo.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
            (float *)0x0) {
          paVar6 = paVar1;
        }
        pbrt::Image::SetChannel
                  (__return_storage_ptr__,PVar10,(int)lVar11,FVar13 * paVar6->fixed[lVar11]);
      }
      pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                (&albedo.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>);
      TVar5 = (__return_storage_ptr__->resolution).super_Tuple2<pbrt::Point2,_int>;
    }
    lVar11 = local_350 + 1;
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&f.super__Vector_base<float,_std::allocator<float>_>);
  pbrt::Image::~Image(&illum);
  return __return_storage_ptr__;
}

Assistant:

Image denoiseImage(const Image &in, const ImageChannelDesc &Ldesc,
                   const Image &varianceImage, const ImageChannelDesc &albedoDesc,
                   const ImageChannelDesc &zDesc, const ImageChannelDesc &deltaZDesc,
                   const ImageChannelDesc &nDesc, int halfWidth, int nLevels) {
    Image illum(PixelFormat::Float, in.Resolution(), {"R", "G", "B"});
    for (int y = 0; y < in.Resolution().y; ++y)
        for (int x = 0; x < in.Resolution().x; ++x) {
            ImageChannelValues albedo = in.GetChannels({x, y}, albedoDesc);
            ImageChannelValues L = in.GetChannels({x, y}, Ldesc);
            for (int c = 0; c < 3; ++c)
                if (albedo[c] > 0)
                    illum.SetChannel({x, y}, c, L[c] / albedo[c]);
                else
                    illum.SetChannel({x, y}, c, L[c]);
        }

    std::vector<Float> f(halfWidth + 1, 0.);
    for (int i = 0; i <= halfWidth; ++i)
        f[i] = FastExp(-Float(i) / halfWidth * 3.f);

    static int call = -1;
    ++call;

    Image currentImage = std::move(illum);
    for (int i = 0; i < nLevels; ++i) {
        int delta = 1 << i;  // A-Trous step between samples.

        Image filtered(PixelFormat::Float, in.Resolution(), {"R", "G", "B"});
        // Image wImage(PixelFormat::Float, in.Resolution(), 3, "Wp,Wn,Wc");
        // Image dzImage(PixelFormat::Float, in.Resolution(), 1, "Y");

        ParallelFor(0, currentImage.Resolution().y, [&](int64_t start, int64_t end) {
            for (int y = start; y < end; ++y) {
                for (int x = 0; x < currentImage.Resolution().x; ++x) {
                    float wsum = 0;
                    ImageChannelValues c = currentImage.GetChannels({x, y});

                    Float z = in.GetChannels({x, y}, zDesc);
                    // FIXME: hack multiply to cancel out scaled ray
                    // differentials...
                    Float dzdx = 8 * in.GetChannels({x, y}, deltaZDesc)[0];
                    Float dzdy = 8 * in.GetChannels({x, y}, deltaZDesc)[1];

                    ImageChannelValues nChan = in.GetChannels({x, y}, nDesc);
                    Normal3f n = Normal3f(nChan[0], nChan[1], nChan[2]);
                    if (n == Normal3f(0, 0, 0))
                        // background pixel
                        continue;

                    Float pixelVariance = varianceImage.GetChannel({x, y}, 0);
                    float result[3] = {0.f};
                    float wpSum = 0, wnSum = 0, wcSum = 0;
                    // if (pixelVariance > .001) {
                    // pixelVariance = std::max<Float>(pixelVariance,
                    // .000001); {
                    {
                        // Higher sigma -> more blur
                        // Float sigma_y = .05;
                        Float sigma_z = .005;

                        // sigma_y = pixelVariance * 50;
                        // sigma_y = std::sqrt(std::sqrt(pixelVariance)) *
                        // 10 * sigmaYScale;

                        for (int dy = -halfWidth * delta; dy <= halfWidth * delta;
                             dy += delta) {
                            if (y + dy < 0 || y + dy >= currentImage.Resolution().y)
                                continue;
                            for (int dx = -halfWidth * delta; dx <= halfWidth * delta;
                                 dx += delta) {
                                if (x + dx < 0 || x + dx >= currentImage.Resolution().x)
                                    continue;
                                ImageChannelValues co =
                                    currentImage.GetChannels({x + dx, y + dy});
                                Float dc2 = (Sqr(c[0] - co[0]) + Sqr(c[1] - co[1]) +
                                             Sqr(c[2] - co[2]));  // squared color
                                                                  // difference
                                Float otherVariance =
                                    varianceImage.GetChannel({x + dx, y + dy}, 0);
                                Float d2 =
                                    std::max<Float>(0, dc2 - (pixelVariance +
                                                              std::min(pixelVariance,
                                                                       otherVariance))) /
                                    (1e-4 + 0.36f * (pixelVariance + otherVariance));

                                Float zo = in.GetChannels({x + dx, y + dy}, zDesc);
                                ImageChannelValues noChan =
                                    in.GetChannels({x + dx, y + dy}, nDesc);
                                Normal3f no = Normal3f(noChan[0], noChan[1], noChan[2]);
                                if (no == Normal3f(0, 0, 0))
                                    // background pixel;
                                    continue;

                                Float zp = z + dx * dzdx + dy * dzdy;
                                Float dz = (z - zp) / ((z + zp) * 0.5f);

                                // Assume camera space position...
                                Float wp = Gaussian(dz, 0, sigma_z) *
                                           f[std::abs(dy / delta)] *
                                           f[std::abs(dx / delta)];
                                Float wn = Pow<32>(std::max<float>(0, Dot(n, no)));
                                Float wc =
                                    FastExp(-d2 / 90);  // Gaussian(dc, 0, sigma_y);
                                CHECK(!std::isnan(wc));
                                wpSum += wp;
                                wnSum += wn;
                                wcSum += wc;
                                Float w = wp * wn * wc;

                                // CO fprintf(stderr, "(%d, %d) dc2 %f var
                                // %f other var %f -> d2 %f\n", CO x, y,
                                // dc2, pixelVariance, otherVariance, d2);

                                CHECK(!std::isnan(w));
                                if (w == 0)
                                    continue;

                                for (int c = 0; c < 3; ++c) {
                                    result[c] +=
                                        w * currentImage.GetChannel({x + dx, y + dy}, c);
                                    CHECK(!std::isnan(result[c]));
                                }
                                wsum += w;
                            }
                        }
                    }
                    for (int c = 0; c < 3; ++c)
                        if (wsum > 0) {
                            filtered.SetChannel({x, y}, c, result[c] / wsum);
                            // wImage.SetChannels({x, y}, {wpSum, wnSum,
                            // wcSum});
                        } else
                            filtered.SetChannel({x, y}, c,
                                                currentImage.GetChannel({x, y}, c));
                }
            }
        });

        // filtered.Write(StringPrintf("filtered-%d-%d.exr", call, i));
        // wImage.Write(StringPrintf("weights%d.exr", i));
        //        if (i == 0)
        //  dzImage.Write("dz.exr");

        pstd::swap(filtered, currentImage);
    }

    // static int i = 0;
    // currentImage.Write(StringPrintf("filteredillum-%d.exr", i++));

    // reincorporate albedo
    for (int y = 0; y < currentImage.Resolution().y; ++y)
        for (int x = 0; x < currentImage.Resolution().x; ++x) {
            ImageChannelValues albedo = in.GetChannels({x, y}, albedoDesc);
            for (int c = 0; c < 3; ++c)
                currentImage.SetChannel({x, y}, c,
                                        currentImage.GetChannel({x, y}, c) * albedo[c]);
        }

    return currentImage;
}